

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::ComplexOptionType3::Clear(ComplexOptionType3 *this)

{
  ComplexOptionType3_ComplexOptionType5 *this_00;
  LogMessageFatal LStack_18;
  
  if ((undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x1) !=
      (undefined1  [24])0x0) {
    this_00 = (this->field_0)._impl_.complexoptiontype5_;
    if (this_00 == (ComplexOptionType3_ComplexOptionType5 *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_custom_options.pb.cc"
                 ,0x126f,"_impl_.complexoptiontype5_ != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
    }
    ComplexOptionType3_ComplexOptionType5::Clear(this_00);
  }
  (this->field_0)._impl_.moo_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ComplexOptionType3::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.ComplexOptionType3)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.complexoptiontype5_ != nullptr);
    _impl_.complexoptiontype5_->Clear();
  }
  _impl_.moo_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}